

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinear.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinear::SetGuideConstraint
          (ChLinkMotorLinear *this,bool mc_y,bool mc_z,bool mc_rx,bool mc_ry,bool mc_rz)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  
  auVar2 = vpbroadcastb_avx512vl(ZEXT116(1));
  uVar1 = (ushort)(byte)(mc_y * auVar2[0]);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = (bool)(char)uVar1;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z = (bool)(char)(uVar1 >> 8);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx =
       (bool)(-(char)((short)((ushort)mc_rx << 0xf) >> 0xf) * auVar2[2]);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = (bool)(mc_ry * auVar2[3]);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rz = mc_rz;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  return;
}

Assistant:

void ChLinkMotorLinear::SetGuideConstraint(bool mc_y, bool mc_z, bool mc_rx, bool mc_ry, bool mc_rz) {
    this->c_y = mc_y;
    this->c_z = mc_z;
    this->c_rx = mc_rx;
    this->c_ry = mc_ry;
    this->c_rz = mc_rz;
    SetupLinkMask();
}